

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O3

string * __thiscall
SpeciesTracker::GatherCounts_abi_cxx11_
          (string *__return_storage_ptr__,SpeciesTracker *this,double time_stamp)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  double dVar4;
  int iVar5;
  iterator iVar6;
  string *this_00;
  _Rb_tree_color _Var7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  iterator iVar10;
  mapped_type_conflict *pmVar11;
  long *plVar12;
  undefined8 *puVar13;
  _Rb_tree_node_base *p_Var14;
  long *plVar15;
  ulong *puVar16;
  ulong uVar17;
  undefined8 uVar18;
  string *out_string;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  elem;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  output;
  undefined8 *local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  string *local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>
  local_200;
  undefined8 *local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong *local_188;
  long local_180;
  ulong local_178;
  long lStack_170;
  ulong *local_168;
  long local_160;
  ulong local_158;
  long lStack_150;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  double local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var9 = (this->species_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->species_)._M_t._M_impl.super__Rb_tree_header;
  local_208 = __return_storage_ptr__;
  local_88 = time_stamp;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    paVar3 = &local_200.first.field_2;
    do {
      local_200.first._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_200,*(long *)(p_Var9 + 1),
                 (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
      local_200.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = p_Var9[2]._M_color;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                             *)&local_80,&local_200.first);
      local_228 = (long *)(double)(int)(_Rb_tree_color)
                                       local_200.second.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start;
      iVar6._M_current =
           (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (pmVar8,iVar6,(double *)&local_228);
      }
      else {
        *iVar6._M_current = (double)local_228;
        (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                             *)&local_80,&local_200.first);
      local_228 = (long *)0x0;
      iVar6._M_current =
           (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (pmVar8,iVar6,(double *)&local_228);
      }
      else {
        *iVar6._M_current = 0.0;
        (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                             *)&local_80,&local_200.first);
      local_228 = (long *)0x0;
      iVar6._M_current =
           (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (pmVar8,iVar6,(double *)&local_228);
      }
      else {
        *iVar6._M_current = 0.0;
        (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200.first._M_dataplus._M_p != paVar3) {
        operator_delete(local_200.first._M_dataplus._M_p);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  p_Var9 = (this->transcripts_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->transcripts_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      local_200.first._M_dataplus._M_p = (pointer)&local_200.first.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_200,*(long *)(p_Var9 + 1),
                 (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
      local_200.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = p_Var9[2]._M_color;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                             *)&local_80,&local_200.first);
      _Var7 = (_Rb_tree_color)
              local_200.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
      if ((long)(pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start == 0x18) {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                               *)&local_80,&local_200.first);
        (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[1] = (double)(int)_Var7;
      }
      else {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                               *)&local_80,&local_200.first);
        local_228 = (long *)0x0;
        iVar6._M_current =
             (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (pmVar8,iVar6,(double *)&local_228);
        }
        else {
          *iVar6._M_current = 0.0;
          (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                               *)&local_80,&local_200.first);
        local_228 = (long *)(double)(int)(_Rb_tree_color)
                                         local_200.second.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start;
        iVar6._M_current =
             (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (pmVar8,iVar6,(double *)&local_228);
        }
        else {
          *iVar6._M_current = (double)local_228;
          (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                               *)&local_80,&local_200.first);
        local_228 = (long *)0x0;
        iVar6._M_current =
             (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (pmVar8,iVar6,(double *)&local_228);
        }
        else {
          *iVar6._M_current = 0.0;
          (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
      }
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&(this->ribo_per_transcript_)._M_t,&local_200.first);
      if ((_Rb_tree_header *)iVar10._M_node !=
          &(this->ribo_per_transcript_)._M_t._M_impl.super__Rb_tree_header) {
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&this->ribo_per_transcript_,&local_200.first);
        iVar5 = *pmVar11;
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                               *)&local_80,&local_200.first);
        dVar4 = (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[1];
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                               *)&local_80,&local_200.first);
        (pmVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[2] = (double)iVar5 / dVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200.first._M_dataplus._M_p != &local_200.first.field_2) {
        operator_delete(local_200.first._M_dataplus._M_p);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  this_00 = local_208;
  (local_208->_M_dataplus)._M_p = (pointer)&local_208->field_2;
  local_208->_M_string_length = 0;
  (local_208->field_2)._M_local_buf[0] = '\0';
  p_Var14 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_80._M_impl.super__Rb_tree_header) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>
      ::pair(&local_200,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>
              *)(p_Var14 + 1));
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x148,"%f",SUB84(local_88,0));
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_248 = &local_238;
      plVar15 = plVar12 + 2;
      if ((long *)*plVar12 == plVar15) {
        local_238 = *plVar15;
        lStack_230 = plVar12[3];
      }
      else {
        local_238 = *plVar15;
        local_248 = (long *)*plVar12;
      }
      local_240 = plVar12[1];
      *plVar12 = (long)plVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_248,(ulong)local_200.first._M_dataplus._M_p);
      local_c8 = &local_b8;
      plVar15 = plVar12 + 2;
      if ((long *)*plVar12 == plVar15) {
        local_b8 = *plVar15;
        lStack_b0 = plVar12[3];
      }
      else {
        local_b8 = *plVar15;
        local_c8 = (long *)*plVar12;
      }
      local_c0 = plVar12[1];
      *plVar12 = (long)plVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_188 = &local_178;
      puVar16 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar16) {
        local_178 = *puVar16;
        lStack_170 = plVar12[3];
      }
      else {
        local_178 = *puVar16;
        local_188 = (ulong *)*plVar12;
      }
      local_180 = plVar12[1];
      *plVar12 = (long)puVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_e8,vsnprintf,0x148,"%f",
                 (int)*(undefined8 *)
                       CONCAT44(local_200.second.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (_Rb_tree_color)
                                local_200.second.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start));
      uVar17 = 0xf;
      if (local_188 != &local_178) {
        uVar17 = local_178;
      }
      if (uVar17 < local_e8._M_string_length + local_180) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          uVar18 = local_e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_e8._M_string_length + local_180) goto LAB_00123cf5;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_188);
      }
      else {
LAB_00123cf5:
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_188,(ulong)local_e8._M_dataplus._M_p);
      }
      local_268 = &local_258;
      puVar2 = puVar13 + 2;
      if ((undefined8 *)*puVar13 == puVar2) {
        local_258 = *puVar2;
        uStack_250 = puVar13[3];
      }
      else {
        local_258 = *puVar2;
        local_268 = (undefined8 *)*puVar13;
      }
      local_260 = puVar13[1];
      *puVar13 = puVar2;
      puVar13[1] = 0;
      *(undefined1 *)puVar2 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_168 = &local_158;
      puVar16 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar16) {
        local_158 = *puVar16;
        lStack_150 = plVar12[3];
      }
      else {
        local_158 = *puVar16;
        local_168 = (ulong *)*plVar12;
      }
      local_160 = plVar12[1];
      *plVar12 = (long)puVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_108,vsnprintf,0x148,"%f",
                 (int)*(undefined8 *)
                       (CONCAT44(local_200.second.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 (_Rb_tree_color)
                                 local_200.second.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start) + 8));
      uVar17 = 0xf;
      if (local_168 != &local_158) {
        uVar17 = local_158;
      }
      if (uVar17 < local_108._M_string_length + local_160) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          uVar18 = local_108.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_108._M_string_length + local_160) goto LAB_00123e50;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_168);
      }
      else {
LAB_00123e50:
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_168,(ulong)local_108._M_dataplus._M_p);
      }
      local_1c8 = &local_1b8;
      puVar2 = puVar13 + 2;
      if ((undefined8 *)*puVar13 == puVar2) {
        local_1b8 = *puVar2;
        uStack_1b0 = puVar13[3];
      }
      else {
        local_1b8 = *puVar2;
        local_1c8 = (undefined8 *)*puVar13;
      }
      local_1c0 = puVar13[1];
      *puVar13 = puVar2;
      puVar13[1] = 0;
      *(undefined1 *)puVar2 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      puVar16 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar16) {
        local_138 = *puVar16;
        lStack_130 = plVar12[3];
        local_148 = &local_138;
      }
      else {
        local_138 = *puVar16;
        local_148 = (ulong *)*plVar12;
      }
      local_140 = plVar12[1];
      *plVar12 = (long)puVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_128,vsnprintf,0x148,"%f",
                 (int)*(undefined8 *)
                       (CONCAT44(local_200.second.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 (_Rb_tree_color)
                                 local_200.second.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start) + 0x10));
      uVar17 = 0xf;
      if (local_148 != &local_138) {
        uVar17 = local_138;
      }
      if (uVar17 < local_128._M_string_length + local_140) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          uVar18 = local_128.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_128._M_string_length + local_140) goto LAB_00123fae;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_148);
      }
      else {
LAB_00123fae:
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_148,(ulong)local_128._M_dataplus._M_p);
      }
      local_1a8 = &local_198;
      puVar2 = puVar13 + 2;
      if ((undefined8 *)*puVar13 == puVar2) {
        local_198 = *puVar2;
        uStack_190 = puVar13[3];
      }
      else {
        local_198 = *puVar2;
        local_1a8 = (undefined8 *)*puVar13;
      }
      local_1a0 = puVar13[1];
      *puVar13 = puVar2;
      puVar13[1] = 0;
      *(undefined1 *)puVar2 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_1a8);
      local_a8 = &local_98;
      plVar15 = plVar12 + 2;
      if ((long *)*plVar12 == plVar15) {
        local_98 = *plVar15;
        lStack_90 = plVar12[3];
      }
      else {
        local_98 = *plVar15;
        local_a8 = (long *)*plVar12;
      }
      local_a0 = plVar12[1];
      *plVar12 = (long)plVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_a8,0,(char *)0x0,(ulong)(this_00->_M_dataplus)._M_p
                                  );
      plVar15 = plVar12 + 2;
      if ((long *)*plVar12 == plVar15) {
        local_218 = *plVar15;
        lStack_210 = plVar12[3];
        local_228 = &local_218;
      }
      else {
        local_218 = *plVar15;
        local_228 = (long *)*plVar12;
      }
      local_220 = plVar12[1];
      *plVar12 = (long)plVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_228);
      if (local_228 != &local_218) {
        operator_delete(local_228);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_188 != &local_178) {
        operator_delete(local_188);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((void *)CONCAT44(local_200.second.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           (_Rb_tree_color)
                           local_200.second.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_200.second.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start._4_4_,
                                         (_Rb_tree_color)
                                         local_200.second.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200.first._M_dataplus._M_p != &local_200.first.field_2) {
        operator_delete(local_200.first._M_dataplus._M_p);
      }
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while ((_Rb_tree_header *)p_Var14 != &local_80._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~_Rb_tree(&local_80);
  return this_00;
}

Assistant:

const std::string SpeciesTracker::GatherCounts(double time_stamp) {
  std::map<std::string, std::vector<double>> output;
  for (auto elem : species_) {
    output[elem.first].push_back(elem.second);
    output[elem.first].push_back(0);
    output[elem.first].push_back(0);
  }
  for (auto transcript : transcripts_) {
    if (output[transcript.first].size() == 3) {
      output[transcript.first][1] = transcript.second;
    } else {
      output[transcript.first].push_back(0);
      output[transcript.first].push_back(transcript.second);
      output[transcript.first].push_back(0);
    }
    if (ribo_per_transcript_.find(transcript.first) !=
        ribo_per_transcript_.end()) {
      output[transcript.first][2] =
          double(ribo_per_transcript_[transcript.first]) /
          double(output[transcript.first][1]);
    }
  }
  std::string out_string;
  for (auto row : output) {
    out_string = out_string + (std::to_string(time_stamp) + "\t" + row.first +
                               "\t" + std::to_string(row.second[0]) + "\t" +
                               std::to_string(row.second[1]) + "\t" +
                               std::to_string(row.second[2]) + "\n");

  }
  return out_string;
}